

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTimeCoordinator.cpp
# Opt level: O2

void __thiscall
helics::BaseTimeCoordinator::enteringExecMode(BaseTimeCoordinator *this,IterationRequest param_1)

{
  int iVar1;
  pointer pDVar2;
  pointer pDVar3;
  bool bVar4;
  bool bVar5;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> res;
  ActionMessage error;
  undefined1 local_f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  ActionMessage local_d0;
  
  if (this->executionMode == false) {
    this->checkingExec = true;
    pDVar2 = (this->dependencies).dependencies.
             super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pDVar3 = pDVar2;
    if (pDVar2 != (this->dependencies).dependencies.
                  super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      (*this->_vptr_BaseTimeCoordinator[2])(this);
      TimeDependencies::checkForIssues_abi_cxx11_
                ((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_f8,&this->dependencies,false);
      if (local_f8._0_4_ != 0) {
        ActionMessage::ActionMessage(&local_d0,cmd_global_error);
        local_d0.dest_id.gid = 0;
        local_d0.source_id.gid = (this->mSourceId).gid;
        local_d0.messageID = local_f8._0_4_;
        SmallBuffer::operator=
                  (&local_d0.payload,
                   &((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_f8)->second);
        std::function<void_(const_helics::ActionMessage_&)>::operator()
                  (&this->sendMessageFunction,&local_d0);
        ActionMessage::~ActionMessage(&local_d0);
        std::__cxx11::string::~string
                  ((string *)
                   &((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_f8)->second);
        return;
      }
      std::__cxx11::string::~string
                ((string *)
                 &((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_f8)->second);
      pDVar3 = (this->dependencies).dependencies.
               super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pDVar2 = (this->dependencies).dependencies.
               super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    }
    this->noParent = true;
    bVar4 = true;
    bVar5 = true;
    for (; pDVar3 != pDVar2; pDVar3 = pDVar3 + 1) {
      if (pDVar3->connection == CHILD) {
        iVar1 = (pDVar3->fedID).gid;
        if (iVar1 == 1) {
          bVar4 = false;
        }
        bVar5 = bVar4;
        if (0x6fffffff < iVar1) {
          bVar5 = false;
          bVar4 = false;
        }
      }
      else if (pDVar3->connection == PARENT) {
        this->noParent = false;
        bVar5 = false;
        break;
      }
    }
    this->federatesOnly = bVar5;
    sendTimingInfo(this);
  }
  return;
}

Assistant:

void BaseTimeCoordinator::enteringExecMode(IterationRequest /*mode*/)
{
    if (executionMode) {
        return;
    }
    checkingExec = true;
    if (!dependencies.empty()) {
        updateTimeFactors();
        auto res = dependencies.checkForIssues(false);
        if (res.first != 0) {
            ActionMessage error(CMD_GLOBAL_ERROR);
            error.dest_id = parent_broker_id;
            error.source_id = mSourceId;
            error.messageID = res.first;
            error.payload = res.second;
            sendMessageFunction(error);
            return;
        }
    }
    bool fedOnly = true;
    noParent = true;
    for (const auto& dep : dependencies) {
        if (dep.connection == ConnectionType::PARENT) {
            fedOnly = false;
            noParent = false;
            break;
        }
        if (dep.connection == ConnectionType::CHILD && dep.fedID.isBroker()) {
            fedOnly = false;
        }
    }
    federatesOnly = fedOnly;
    sendTimingInfo();
}